

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O0

optional<Storage::Disk::FAT::Volume> *
Storage::Disk::FAT::GetVolume
          (optional<Storage::Disk::FAT::Volume> *__return_storage_ptr__,
          shared_ptr<Storage::Disk::Disk> *disk)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  int head;
  uint8_t sector_00;
  int iVar4;
  bool bVar5;
  int iVar6;
  Sector *pSVar7;
  const_reference pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  byte *pbVar11;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  reference pvVar12;
  CHS CVar13;
  bool local_211;
  Directory local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  Sector *local_1a8;
  Sector *sector;
  int local_198;
  undefined8 local_190;
  CHS address_1;
  int sector_number_1;
  size_t c_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> root_directory;
  ulong uStack_158;
  uint32_t double_cluster;
  size_t c_1;
  Sector *fat_sector;
  int local_110;
  int iStack_10c;
  CHS address;
  int local_fc;
  int sector_number;
  int c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> source_fat;
  size_t root_directory_sectors;
  undefined1 local_d0 [6];
  uint16_t root_directory_entries;
  Volume volume;
  value_type *data;
  Sector *boot_sector;
  Parser parser;
  shared_ptr<Storage::Disk::Disk> *disk_local;
  
  parser.sectors_by_address_by_track_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)disk;
  Encodings::MFM::Parser::Parser((Parser *)&boot_sector,Double,disk);
  pSVar7 = Encodings::MFM::Parser::sector((Parser *)&boot_sector,0,0,'\x01');
  if (pSVar7 != (Sector *)0x0) {
    bVar5 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::empty(&pSVar7->samples);
    if (!bVar5) {
      pvVar8 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&pSVar7->samples,0);
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar8);
      if (0x1ff < sVar9) {
        volume.root_directory.
        super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](&pSVar7->samples,0);
        Volume::Volume((Volume *)local_d0);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0xb);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0xc);
        local_d0._0_2_ = CONCAT11(*pvVar10,vVar1);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0xd);
        local_d0[2] = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0xe);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0xf);
        local_d0._4_2_ = CONCAT11(*pvVar10,vVar1);
        pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x10);
        root_directory_entries._0_1_ = *pbVar11;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x11);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12);
        vVar2 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x13);
        vVar3 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x14);
        volume.bytes_per_sector = CONCAT11(*pvVar10,vVar3);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x16);
        vVar3 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x17);
        volume._3_1_ = *pvVar10;
        volume.sectors_per_cluster = vVar3;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x18);
        vVar3 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x19);
        volume.reserved_sectors = CONCAT11(*pvVar10,vVar3);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1a);
        vVar3 = *pvVar10;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1b);
        volume._7_1_ = *pvVar10;
        volume.fat_copies = vVar3;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             volume.root_directory.
                             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1fe);
        local_211 = false;
        if (*pvVar10 == 'U') {
          pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               volume.root_directory.
                               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1ff);
          local_211 = *pvVar10 == 0xaa;
        }
        volume.sectors_per_fat._0_1_ = local_211;
        iVar6 = (int)((uint)CONCAT11(vVar2,vVar1) * 0x20 + (uint)(ushort)local_d0._0_2_ + -1) /
                (int)(uint)(ushort)local_d0._0_2_;
        source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(long)iVar6;
        volume._12_4_ =
             (uint)(ushort)local_d0._4_2_ +
             (uint)(ushort)volume._2_2_ * (uint)(byte)root_directory_entries + iVar6;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector_number);
        for (local_fc = 0; local_fc < (int)(uint)(ushort)volume._2_2_; local_fc = local_fc + 1) {
          CVar13 = Volume::chs_for_sector
                             ((Volume *)local_d0,(uint)(ushort)local_d0._4_2_ + local_fc);
          local_110 = CVar13.cylinder;
          iStack_10c = CVar13.head;
          address.cylinder._0_1_ = (uint8_t)CVar13.sector;
          pSVar7 = Encodings::MFM::Parser::sector
                             ((Parser *)&boot_sector,iStack_10c,local_110,(uint8_t)address.cylinder)
          ;
          if (pSVar7 == (Sector *)0x0) {
LAB_00994406:
            std::optional<Storage::Disk::FAT::Volume>::optional(__return_storage_ptr__);
            goto LAB_00994856;
          }
          bVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::empty(&pSVar7->samples);
          if (bVar5) goto LAB_00994406;
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar7->samples,0);
          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar8);
          if (sVar9 != (ushort)local_d0._0_2_) goto LAB_00994406;
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar7->samples,0);
          __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar8);
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar7->samples,0);
          __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
          __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &sector_number);
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__last._M_current,__result);
        }
        uStack_158 = 0;
        while( true ) {
          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector_number
                            );
          if (sVar9 <= uStack_158) break;
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &sector_number,uStack_158);
          vVar1 = *pvVar12;
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &sector_number,uStack_158 + 1);
          vVar2 = *pvVar12;
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &sector_number,uStack_158 + 2);
          root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               (uint)CONCAT12(*pvVar12,CONCAT11(vVar2,vVar1));
          root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_2_ = CONCAT11(vVar2,vVar1) & 0xfff;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &volume.hidden_sectors,
                     (value_type_conflict4 *)
                     ((long)&root_directory.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
          root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_2_ =
               (undefined2)
               (root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ >> 0xc);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &volume.hidden_sectors,
                     (value_type_conflict4 *)
                     &root_directory.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          uStack_158 = uStack_158 + 3;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
        for (stack0xfffffffffffffe80 = (pointer)0x0;
            stack0xfffffffffffffe80 <
            source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
            register0x00000000 = stack0xfffffffffffffe80 + 1) {
          address_1.head =
               (uint)(ushort)local_d0._4_2_ + address_1.sector +
               (uint)(ushort)volume._2_2_ * (uint)(byte)root_directory_entries;
          _sector = Volume::chs_for_sector((Volume *)local_d0,address_1.head);
          address_1.cylinder = local_198;
          iVar4 = address_1.cylinder;
          local_190 = sector;
          pSVar7 = local_190;
          local_190._0_4_ = (int)sector;
          iVar6 = (int)local_190;
          local_190._4_4_ = sector._4_4_;
          head = local_190._4_4_;
          address_1.cylinder._0_1_ = sector._8_1_;
          sector_00 = (uint8_t)address_1.cylinder;
          local_190 = pSVar7;
          address_1.cylinder = iVar4;
          local_1a8 = Encodings::MFM::Parser::sector((Parser *)&boot_sector,head,iVar6,sector_00);
          if (local_1a8 == (Sector *)0x0) {
LAB_00994708:
            std::optional<Storage::Disk::FAT::Volume>::optional(__return_storage_ptr__);
            goto LAB_0099484a;
          }
          bVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::empty(&local_1a8->samples);
          if (bVar5) goto LAB_00994708;
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&local_1a8->samples,0);
          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar8);
          if (sVar9 != (ushort)local_d0._0_2_) goto LAB_00994708;
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&local_1a8->samples,0);
          local_1b8._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar8);
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&local_1a8->samples,0);
          local_1c0._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
          local_1c8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
          local_1d0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                (local_1b8,local_1c0,
                                 (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_1c8);
        }
        anon_unknown.dwarf_fe8b1c::directory_from
                  (&local_1e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
        std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::operator=
                  ((vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_> *)
                   &volume.fat.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e8);
        std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
                  (&local_1e8);
        std::optional<Storage::Disk::FAT::Volume>::optional<Storage::Disk::FAT::Volume,_true>
                  (__return_storage_ptr__,(Volume *)local_d0);
LAB_0099484a:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
LAB_00994856:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector_number);
        Volume::~Volume((Volume *)local_d0);
        goto LAB_0099488a;
      }
    }
  }
  std::optional<Storage::Disk::FAT::Volume>::optional(__return_storage_ptr__);
LAB_0099488a:
  Encodings::MFM::Parser::~Parser((Parser *)&boot_sector);
  return __return_storage_ptr__;
}

Assistant:

std::optional<FAT::Volume> FAT::GetVolume(const std::shared_ptr<Storage::Disk::Disk> &disk) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	// Grab the boot sector; that'll be enough to establish the volume.
	const Storage::Encodings::MFM::Sector *const boot_sector = parser.sector(0, 0, 1);
	if(!boot_sector || boot_sector->samples.empty() || boot_sector->samples[0].size() < 512) {
		return std::nullopt;
	}

	// Obtain volume details.
	const auto &data = boot_sector->samples[0];
	FAT::Volume volume;
	volume.bytes_per_sector = uint16_t(data[11] | (data[12] << 8));
	volume.sectors_per_cluster = data[13];
	volume.reserved_sectors = uint16_t(data[14] | (data[15] << 8));
	volume.fat_copies = data[16];
	const uint16_t root_directory_entries = uint16_t(data[17] | (data[18] << 8));
	volume.total_sectors = uint16_t(data[19] | (data[20] << 8));
	volume.sectors_per_fat = uint16_t(data[22] | (data[23] << 8));
	volume.sectors_per_track = uint16_t(data[24] | (data[25] << 8));
	volume.head_count = uint16_t(data[26] | (data[27] << 8));
	volume.correct_signature = data[510] == 0x55 && data[511] == 0xaa;

	const size_t root_directory_sectors = (root_directory_entries*32 + volume.bytes_per_sector - 1) / volume.bytes_per_sector;
	volume.first_data_sector = int(volume.reserved_sectors + volume.sectors_per_fat*volume.fat_copies + root_directory_sectors);

	// Grab the FAT.
	std::vector<uint8_t> source_fat;
	for(int c = 0; c < volume.sectors_per_fat; c++) {
		const int sector_number = volume.reserved_sectors + c;
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const fat_sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!fat_sector || fat_sector->samples.empty() || fat_sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(fat_sector->samples[0].begin(), fat_sector->samples[0].end(), std::back_inserter(source_fat));
	}

	// Decode the FAT.
	// TODO: stop assuming FAT12 here.
	for(size_t c = 0; c < source_fat.size(); c += 3) {
		const uint32_t double_cluster = uint32_t(source_fat[c] + (source_fat[c + 1] << 8) + (source_fat[c + 2] << 16));
		volume.fat.push_back(uint16_t(double_cluster & 0xfff));
		volume.fat.push_back(uint16_t(double_cluster >> 12));
	}

	// Grab the root directory.
	std::vector<uint8_t> root_directory;
	for(size_t c = 0; c < root_directory_sectors; c++) {
		const auto sector_number = int(volume.reserved_sectors + c + volume.sectors_per_fat*volume.fat_copies);
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!sector || sector->samples.empty() || sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(sector->samples[0].begin(), sector->samples[0].end(), std::back_inserter(root_directory));
	}
	volume.root_directory = directory_from(root_directory);

	return volume;
}